

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_TestCubeTileYResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYResource_Test *this)

{
  undefined4 uVar1;
  GMM_MULTI_TILE_ARCH GVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  GMM_RESOURCE_INFO *pGVar6;
  char *pcVar7;
  AssertHelper local_2e8;
  Message local_2e0;
  uint local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_7;
  Message local_2b8;
  uint local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  Message local_290;
  uint local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_5;
  Message local_268;
  uint local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  GMM_REQ_OFFSET_INFO OffsetInfo_1;
  uint32_t CubeFaceIndex_1;
  uint32_t ExpectedQPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *ResourceInfo_1;
  TEST_BPP bpp_1;
  uint32_t i_1;
  Message local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_3;
  Message local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148 [3];
  undefined4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint32_t CubeFaceIndex;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [1] [2];
  uint32_t VAlign;
  uint32_t HAlign;
  CTestGen9Resource_TestCubeTileYResource_Test *this_local;
  
  gmmParams.MultiTileArch._0_1_ = 0x80;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 0x20;
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_128;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffefffffffff | 0x1000000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  for (ResourceInfo._4_4_ = TEST_BPP_8; ResourceInfo._4_4_ < TEST_BPP_128;
      ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar6 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar6,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar6,4);
    CTestResource::VerifyResourcePitch<true>
              ((CTestResource *)this,pGVar6,gmmParams.MultiTileArch._0_4_);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar6,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar6,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar6,4);
    for (OffsetInfo.StdLayout.TileDepthPitch._4_4_ = 0;
        OffsetInfo.StdLayout.TileDepthPitch._4_4_ < 6;
        OffsetInfo.StdLayout.TileDepthPitch._4_4_ = OffsetInfo.StdLayout.TileDepthPitch._4_4_ + 1) {
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = OffsetInfo.StdLayout.TileDepthPitch._4_4_;
      (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar.message_);
      local_12c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                ((char *)local_128,"0",(int *)"OffsetInfo.Render.Offset64",
                 (unsigned_long *)&local_12c,&OffsetInfo.Lock.Pitch);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar3) {
        testing::Message::Message(local_148);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1b,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      local_164 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_160,"0",(int *)"OffsetInfo.Render.XOffset",&local_164,
                 &OffsetInfo.Render);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar3) {
        testing::Message::Message(&local_170);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1c,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_170);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      local_18c = OffsetInfo.StdLayout.TileDepthPitch._4_4_ << 2;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_188,"CubeFaceIndex * VAlign","OffsetInfo.Render.YOffset",
                 &local_18c,(uint *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar3) {
        testing::Message::Message(&local_198);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1d,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      local_1b4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_1b0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_1b4,
                 &OffsetInfo.Render.XOffset);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar3) {
        testing::Message::Message(&local_1c0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bpp_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc1e,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bpp_1,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bpp_1);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
  }
  for (ResourceInfo_1._4_4_ = TEST_BPP_8; ResourceInfo_1._4_4_ < TEST_BPP_MAX;
      ResourceInfo_1._4_4_ = ResourceInfo_1._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo_1._4_4_);
    GVar2 = gmmParams.MultiTileArch;
    uVar1 = gmmParams.MultiTileArch._0_4_;
    uVar4 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo_1._4_4_);
    gmmParams.field_6.BaseWidth = (uint)uVar1 / uVar4 + 1;
    gmmParams._40_8_ = ZEXT48(gmmParams.field_6.BaseWidth);
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar6 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp,
                        ((ulong)GVar2 & 0xffffffff) % (ulong)uVar4);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar6,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar6,4);
    uVar4 = gmmParams.MultiTileArch._0_4_ * 2;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar6,uVar4);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar6,2);
    uVar5 = (gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar6,(ulong)uVar5);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,pGVar6,
               (ulong)(uVar4 * ((uVar5 * 6 + (gmmParams.MultiTileArch.Reserved - 1)) -
                               (uVar5 * 6 + (gmmParams.MultiTileArch.Reserved - 1) &
                               gmmParams.MultiTileArch.Reserved - 1))));
    for (OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ = 0;
        OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ < 6;
        OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ =
             OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ + 1) {
      OffsetInfo_1.StdLayout.Offset = 0;
      OffsetInfo_1.StdLayout.TileRowPitch = 0;
      OffsetInfo_1.Render.XOffset = 0;
      OffsetInfo_1.Render.YOffset = 0;
      OffsetInfo_1.Render.ZOffset = 0;
      OffsetInfo_1.Render._20_4_ = 0;
      OffsetInfo_1.Lock.Pitch = 0;
      OffsetInfo_1.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo_1.Render.field_0.Offset64 = 0;
      OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
      OffsetInfo_1._28_4_ = 0;
      OffsetInfo_1.Lock.field_0.Offset64 = 0;
      OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo_1.Plane = GMM_NO_PLANE;
      OffsetInfo_1._0_4_ = 0;
      OffsetInfo_1.ArrayIndex = 0;
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo_1.Slice = 0;
      OffsetInfo_1.MipLevel = OffsetInfo_1.StdLayout.TileDepthPitch._4_4_;
      (**(code **)(*(long *)pGVar6 + 0x68))(pGVar6,&gtest_ar_4.message_);
      local_25c = (OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ * uVar5 &
                  -gmmParams.MultiTileArch.Reserved) * uVar4;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_258,
                 "((CubeFaceIndex * ExpectedQPitch) - ((CubeFaceIndex * ExpectedQPitch) & ((TileSize[0][1]) - 1))) * ExpectedPitch"
                 ,"OffsetInfo.Render.Offset64",&local_25c,(unsigned_long *)&OffsetInfo_1.Lock.Pitch)
      ;
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
      if (!bVar3) {
        testing::Message::Message(&local_268);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc48,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_268);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_268);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
      local_284 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_280,"0",(int *)"OffsetInfo.Render.XOffset",&local_284,
                 &OffsetInfo_1.Render);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
      if (!bVar3) {
        testing::Message::Message(&local_290);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc49,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_290);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_290);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
      local_2ac = (OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ * uVar5) %
                  gmmParams.MultiTileArch.Reserved;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_2a8,"(CubeFaceIndex * ExpectedQPitch) % TileSize[0][1]",
                 "OffsetInfo.Render.YOffset",&local_2ac,
                 (uint *)((long)&OffsetInfo_1.Render.field_0 + 4));
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
      if (!bVar3) {
        testing::Message::Message(&local_2b8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4b,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_2b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      local_2d4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_2d0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_2d4,
                 &OffsetInfo_1.Render.XOffset);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
      if (!bVar3) {
        testing::Message::Message(&local_2e0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc4c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
        testing::internal::AssertHelper::~AssertHelper(&local_2e8);
        testing::Message::~Message(&local_2e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar6);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileSize[1][2] = {128, 32};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface within a tile.
    for(uint32_t i = 0; i < TEST_BPP_128; i++) //TEST_BPP_128 cannot fit in a tile as HAlign = 16
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[0][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));    // All 6 faces should be accomated in a tile.
        VerifyResourceQPitch<true>(ResourceInfo, VAlign);        // Each face should be VAlign rows apart within a tile

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(0, OffsetInfo.Render.Offset64);                     // Render offset should be 0 as its on single tile.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);                      // X Offset should be 0
            EXPECT_EQ(CubeFaceIndex * VAlign, OffsetInfo.Render.YOffset); // Y Offset should be VALIGN * CubeFace Index
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height of Cube must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[0][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        uint32_t ExpectedPitch = TileSize[0][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 GMM_ULT_ALIGN(__GMM_MAX_CUBE_FACE * ExpectedQPitch,
                                               TileSize[0][1]));


        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(GMM_ULT_ALIGN_FLOOR(CubeFaceIndex * ExpectedQPitch, TileSize[0][1]) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) % TileSize[0][1],
                      OffsetInfo.Render.YOffset);    // Y Offset should be (CubeFaceIndex * QPitch) % TileHeight
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}